

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

Node * rengine::Node::create(void)

{
  bool bVar1;
  Node *t;
  Node *local_10;
  
  bVar1 = AllocationPool<rengine::Node>::isExhausted(&__allocation_pool_rengine_Node);
  if (bVar1) {
    local_10 = (Node *)operator_new(0x38);
    Node(local_10,BasicNodeType);
  }
  else {
    local_10 = AllocationPool<rengine::Node>::allocate(&__allocation_pool_rengine_Node);
    __mark_as_pool_allocated(local_10);
  }
  return local_10;
}

Assistant:

void __mark_as_pool_allocated() { m_poolAllocated = true; }